

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# our_gl.cpp
# Opt level: O2

void triangle(Model *model,array<vec<4UL,_double>,_3UL> pts,IShader *shader,TGAImage *image,
             DepthBuffer *zbuffer)

{
  double dVar1;
  int iVar2;
  double *pdVar3;
  double *pdVar4;
  vec<2UL,_int> vVar5;
  int j;
  size_t i;
  vec<4UL,_double> *this;
  double dVar6;
  double dVar7;
  double dVar8;
  vec<2UL,_double> vVar9;
  vec2f A;
  vec2f B;
  vec2f C;
  vec2f P;
  vec3f c;
  TGAColor color;
  vec<2UL,_int> local_160;
  double local_158;
  double dStack_150;
  double local_140;
  DepthBuffer *local_138;
  TGAImage *local_130;
  Model *local_128;
  IShader *local_120;
  vec<4UL,_double> *local_118;
  double *local_110;
  vec<4UL,_double> *local_108;
  double *local_100;
  double local_f8;
  double local_f0;
  double local_e8;
  double local_e0;
  vec3f local_d8;
  TGAColor local_c0;
  vec<2UL,_double> local_b8;
  vec<2UL,_double> local_a8;
  vec<4UL,_double> local_90;
  vec<4UL,_double> local_70;
  vec<4UL,_double> local_50;
  
  local_a8.x = 1.79769313486232e+308;
  local_a8.y = 1.79769313486232e+308;
  local_b8.x = -1.79769313486232e+308;
  local_b8.y = -1.79769313486232e+308;
  dVar6 = 0.0;
  local_138 = zbuffer;
  local_130 = image;
  local_128 = model;
  local_120 = shader;
  while (dVar6 != 1.48219693752374e-323) {
    this = pts._M_elems + (long)dVar6;
    local_140 = dVar6;
    for (i = 0; i != 2; i = i + 1) {
      pdVar3 = vec<2UL,_double>::operator[](&local_a8,i);
      pdVar4 = vec<4UL,_double>::operator[](this,i);
      local_158 = *pdVar4 / pts._M_elems[(long)dVar6].data[3];
      if (*pdVar3 <= local_158) {
        local_158 = *pdVar3;
      }
      pdVar3 = vec<2UL,_double>::operator[](&local_a8,i);
      *pdVar3 = local_158;
      pdVar3 = vec<2UL,_double>::operator[](&local_b8,i);
      pdVar4 = vec<4UL,_double>::operator[](this,i);
      local_158 = *pdVar4 / pts._M_elems[(long)dVar6].data[3];
      if (local_158 <= *pdVar3) {
        local_158 = *pdVar3;
      }
      pdVar3 = vec<2UL,_double>::operator[](&local_b8,i);
      *pdVar3 = local_158;
    }
    dVar6 = (double)((long)local_140 + 1);
  }
  local_c0.bytespp = '\0';
  local_c0.bgra[0] = '\0';
  local_c0.bgra[1] = '\0';
  local_c0.bgra[2] = '\0';
  local_c0.bgra[3] = '\0';
  local_100 = pts._M_elems[0].data + 3;
  local_108 = pts._M_elems + 1;
  local_110 = pts._M_elems[1].data + 3;
  local_118 = pts._M_elems + 2;
  for (local_160.x = (int)local_a8.x; local_160.x <= (int)local_b8.x; local_160.x = local_160.x + 1)
  {
    for (local_160.y = (int)local_a8.y; local_160.y <= (int)local_b8.y;
        local_160.y = local_160.y + 1) {
      operator/(&local_50,pts._M_elems,local_100);
      vVar9 = proj<2ul,4ul,double>(&local_50);
      local_140 = vVar9.y;
      local_158 = vVar9.x;
      operator/(&local_70,local_108,local_110);
      vVar9 = proj<2ul,4ul,double>(&local_70);
      local_e8 = vVar9.y;
      local_e0 = vVar9.x;
      operator/(&local_90,local_118,pts._M_elems[2].data + 3);
      vVar9 = proj<2ul,4ul,double>(&local_90);
      local_f8 = vVar9.y;
      local_f0 = vVar9.x;
      vVar5 = proj<2ul,2ul,int>(&local_160);
      P.x = (double)vVar5.x;
      P.y = (double)vVar5.y;
      A.y = local_140;
      A.x = local_158;
      B.y = local_e8;
      B.x = local_e0;
      C.y = local_f8;
      C.x = local_f0;
      barycentric(&local_d8,A,B,C,P);
      dVar6 = (double)CONCAT44(local_d8.x._4_4_,local_d8.x._0_4_);
      dVar1 = (double)CONCAT44(local_d8.y._4_4_,local_d8.y._0_4_);
      dVar8 = local_d8.z * pts._M_elems[2].data[3] +
              dVar6 * pts._M_elems[0].data[3] + pts._M_elems[1].data[3] * dVar1;
      dVar7 = (local_d8.z * pts._M_elems[2].data[2] +
              dVar6 * pts._M_elems[0].data[2] + pts._M_elems[1].data[2] * dVar1) / dVar8 + 0.5;
      if (255.0 <= dVar7) {
        dVar7 = 255.0;
      }
      if (((0.0 <= dVar6) && (0.0 <= dVar1)) && (0.0 <= local_d8.z)) {
        if (dVar7 <= 0.0) {
          dVar7 = 0.0;
        }
        if ((local_138->data).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start
            [(long)local_160.x * local_138->width + (long)local_160.y] <= dVar7) {
          local_158 = dVar7;
          dStack_150 = dVar8;
          iVar2 = (*local_120->_vptr_IShader[3])(local_120,local_128,&local_c0);
          if ((char)iVar2 == '\0') {
            (local_138->data).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start
            [local_138->width * (long)local_160.x + (long)local_160.y] = local_158;
            TGAImage::set(local_130,(long)local_160.x,(long)local_160.y,&local_c0);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void triangle(Model &model, std::array<vec4f, 3> pts, IShader &shader, TGAImage &image,
              DepthBuffer &zbuffer)
{
    vec2f bboxmin(std::numeric_limits<double>::max(), std::numeric_limits<double>::max());
    vec2f bboxmax(-std::numeric_limits<double>::max(), -std::numeric_limits<double>::max());
    for (int i = 0; i < 3; i++) {
        for (int j = 0; j < 2; j++) {
            bboxmin[j] = std::min(bboxmin[j], pts[i][j] / pts[i][3]);
            bboxmax[j] = std::max(bboxmax[j], pts[i][j] / pts[i][3]);
        }
    }
    vec2i P;
    TGAColor color;
    for (P.x = static_cast<int>(bboxmin.x); P.x <= static_cast<int>(bboxmax.x); P.x++) {
        for (P.y = static_cast<int>(bboxmin.y); P.y <= static_cast<int>(bboxmax.y); P.y++) {
            vec3f c = barycentric(proj<2, 4>(pts[0] / pts[0][3]), proj<2, 4>(pts[1] / pts[1][3]),
                                  proj<2, 4>(pts[2] / pts[2][3]), to_f(proj<2, 2>(P)));
            double z = pts[0][2] * c.x + pts[1][2] * c.y + pts[2][2] * c.z;
            double w = pts[0][3] * c.x + pts[1][3] * c.y + pts[2][3] * c.z;
            double frag_depth = std::max(0., std::min(255., z / w + .5));
            if (c.x < 0 || c.y < 0 || c.z < 0 || zbuffer.get(P.x, P.y) > frag_depth) continue;
            bool discard = shader.fragment(model, c, color);
            if (!discard) {
                zbuffer.set(P.x, P.y, frag_depth);
                image.set(P.x, P.y, color);
            }
        }
    }
}